

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O0

_Bool compare_input_and_nyt
                (byte_t *input_buffer,long in_bit_idx,long last_bit_idx,bit_array_t *bit_array_nyt)

{
  byte_t bVar1;
  uint uVar2;
  uint bit_pos;
  long lVar3;
  byte_t value;
  int input_byte_bit_idx;
  byte_t input_byte;
  long byte_idx;
  int offset;
  _Bool have_same_bits;
  int size;
  bit_array_t *bit_array_nyt_local;
  long last_bit_idx_local;
  long in_bit_idx_local;
  byte_t *input_buffer_local;
  
  uVar2 = (uint)bit_array_nyt->length;
  if (last_bit_idx - in_bit_idx < (long)(int)uVar2) {
    input_buffer_local._7_1_ = false;
  }
  else {
    input_buffer_local._7_1_ = true;
    for (byte_idx._4_4_ = 0; byte_idx._4_4_ < (int)uVar2; byte_idx._4_4_ = byte_idx._4_4_ + 1) {
      lVar3 = bit_idx_to_byte_idx(in_bit_idx + byte_idx._4_4_);
      bVar1 = input_buffer[lVar3];
      bit_pos = bit_pos_in_current_byte(in_bit_idx + byte_idx._4_4_);
      bVar1 = bit_check(bVar1,bit_pos);
      if (bVar1 != bit_array_nyt->buffer[(int)((uVar2 - byte_idx._4_4_) + -1)]) {
        return false;
      }
    }
  }
  return input_buffer_local._7_1_;
}

Assistant:

bool compare_input_and_nyt(const byte_t *input_buffer,
        long in_bit_idx,
        long last_bit_idx,
        const bit_array_t *bit_array_nyt) {
    int size = bit_array_nyt->length;
    if(last_bit_idx - in_bit_idx < size)
        return false;

#ifdef _DEBUG
        log_debug("compare_input_and_nyt", "in_bit_idx=%-8d NYT=%s\n",
              in_bit_idx,
              fmt_bit_array(bit_array_nyt));
#endif

    bool have_same_bits = true;
    for(int offset=0; offset<size; offset++) {
        long byte_idx = bit_idx_to_byte_idx(in_bit_idx + offset);
        byte_t input_byte = input_buffer[byte_idx];

        int input_byte_bit_idx = bit_pos_in_current_byte(in_bit_idx + offset);
        byte_t value = bit_check(input_byte, (unsigned int)input_byte_bit_idx);
        if(value != bit_array_nyt->buffer[size-offset-1]) {
            have_same_bits = false;
            break;
        }
    }
    return have_same_bits;
}